

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O1

void __thiscall
Am_Value_List_Data::Add(Am_Value_List_Data *this,Am_Value *value,Am_Add_Position position)

{
  undefined1 *puVar1;
  Am_List_Item *pAVar2;
  bool bVar3;
  Am_List_Item *this_00;
  Am_List_Item **ppAVar4;
  bool bVar5;
  
  puVar1 = &(this->super_Am_Wrapper).field_0xc;
  *(short *)puVar1 = *(short *)puVar1 + 1;
  this_00 = (Am_List_Item *)operator_new(0x20);
  (this_00->super_Am_Value).type = 0;
  (this_00->super_Am_Value).value.wrapper_value = (Am_Wrapper *)0x0;
  this_00->prev = (Am_List_Item *)0x0;
  this_00->next = (Am_List_Item *)0x0;
  Am_Value::operator=((Am_Value *)this_00,value);
  bVar5 = position == Am_HEAD;
  bVar3 = !bVar5;
  pAVar2 = (&this->head)[bVar3];
  ppAVar4 = &pAVar2->prev + bVar3;
  if (pAVar2 == (Am_List_Item *)0x0) {
    ppAVar4 = &this->head + bVar5;
  }
  *ppAVar4 = this_00;
  (&this_00->prev)[bVar3] = (Am_List_Item *)0x0;
  (&this_00->prev)[bVar5] = pAVar2;
  (&this->head)[bVar3] = this_00;
  return;
}

Assistant:

void
Am_Value_List_Data::Add(const Am_Value &value, Am_Add_Position position)
{
  ++number;
  Am_List_Item *item = new Am_List_Item;
  *item = value;
  if (position == Am_HEAD) {
    if (head)
      head->prev = item;
    else
      tail = item;
    item->prev = nullptr;
    item->next = head;
    head = item;
  } else {
    if (tail)
      tail->next = item;
    else
      head = item;
    item->next = nullptr;
    item->prev = tail;
    tail = item;
  }
}